

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat.cpp
# Opt level: O0

int __thiscall
ncnn::Concat::forward
          (Concat *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  bool bVar1;
  const_reference pvVar2;
  size_type sVar3;
  uchar *puVar4;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  uchar *ptr_5;
  Mat *bottom_blob_11;
  size_t b_11;
  int i_1;
  uchar *outptr_5;
  int q_2;
  Mat *top_blob_5;
  Mat *bottom_blob_10;
  size_t b_10;
  int top_w_2;
  int channels_2;
  int h_2;
  uchar *ptr_4;
  int size_2;
  Mat *bottom_blob_9;
  size_t b_9;
  uchar *outptr_4;
  int q_1;
  Mat *top_blob_4;
  Mat *bottom_blob_8;
  size_t b_8;
  int top_h_1;
  int channels_1;
  int w_3;
  uchar *outptr_3;
  uchar *ptr_3;
  size_t size_1;
  int channels;
  Mat *bottom_blob_7;
  size_t b_7;
  int q;
  Mat *top_blob_3;
  Mat *bottom_blob_6;
  size_t b_6;
  int top_channels;
  int h_1;
  int w_2;
  uchar *ptr_2;
  Mat *bottom_blob_5;
  size_t b_5;
  uchar *outptr_2;
  int i;
  Mat *top_blob_2;
  Mat *bottom_blob_4;
  size_t b_4;
  int top_w_1;
  int h;
  uchar *ptr_1;
  int size;
  Mat *bottom_blob_3;
  size_t b_3;
  uchar *outptr_1;
  Mat *top_blob_1;
  Mat *bottom_blob_2;
  size_t b_2;
  int top_h;
  int w_1;
  uchar *ptr;
  int w;
  Mat *bottom_blob_1;
  size_t b_1;
  uchar *outptr;
  Mat *top_blob;
  Mat *bottom_blob;
  size_t b;
  int top_w;
  size_t elemsize;
  int dims;
  Mat *in_stack_fffffffffffffbe0;
  Mat *in_stack_fffffffffffffbe8;
  size_t in_stack_fffffffffffffbf0;
  ulong uVar5;
  undefined8 in_stack_fffffffffffffbf8;
  int iVar6;
  Mat *this_00;
  Mat *in_stack_fffffffffffffc00;
  Mat local_368;
  Mat *local_328;
  const_reference local_320;
  ulong local_318;
  int local_30c;
  Mat local_308;
  uchar *local_2c8;
  int local_2bc;
  reference local_2b8;
  const_reference local_2b0;
  ulong local_2a8;
  int local_29c;
  int local_298;
  int local_294;
  Mat local_290;
  uchar *local_250;
  int local_244;
  const_reference local_240;
  ulong local_238;
  Mat local_230;
  uchar *local_1f0;
  int local_1e4;
  reference local_1e0;
  const_reference local_1d8;
  ulong local_1d0;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  Mat local_1b0;
  uchar *local_170;
  uchar *local_168;
  long local_160;
  int local_154;
  const_reference local_150;
  ulong local_148;
  int local_13c;
  reference local_138;
  const_reference local_130;
  ulong local_128;
  int local_11c;
  int local_118;
  int local_114;
  uchar *local_110;
  const_reference local_108;
  ulong local_100;
  uchar *local_f8;
  int local_ec;
  reference local_e8;
  const_reference local_e0;
  ulong local_d8;
  int local_d0;
  int local_cc;
  uchar *local_c8;
  int local_bc;
  const_reference local_b8;
  ulong local_b0;
  uchar *local_a8;
  reference local_a0;
  const_reference local_98;
  ulong local_90;
  int local_88;
  int local_84;
  uchar *local_80;
  int local_74;
  const_reference local_70;
  ulong local_68;
  uchar *local_60;
  reference local_58;
  const_reference local_50;
  ulong local_48;
  int local_3c;
  size_t local_38;
  int local_2c;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_2c = pvVar2->dims;
  pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
  local_38 = pvVar2->elemsize;
  if (local_2c == 1) {
    local_3c = 0;
    local_48 = 0;
    while( true ) {
      uVar5 = local_48;
      sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
      iVar6 = (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20);
      if (sVar3 <= uVar5) break;
      local_50 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,local_48);
      local_3c = local_50->w + local_3c;
      local_48 = local_48 + 1;
    }
    local_58 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    Mat::create(in_stack_fffffffffffffc00,iVar6,in_stack_fffffffffffffbf0,
                (Allocator *)in_stack_fffffffffffffbe8);
    bVar1 = Mat::empty(in_stack_fffffffffffffbe0);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      local_60 = Mat::operator_cast_to_unsigned_char_(local_58);
      local_68 = 0;
      while( true ) {
        uVar5 = local_68;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
        if (sVar3 <= uVar5) break;
        local_70 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,local_68)
        ;
        local_74 = local_70->w;
        local_80 = Mat::operator_cast_to_unsigned_char_(local_70);
        memcpy(local_60,local_80,(long)local_74 * local_38);
        local_60 = local_60 + (long)local_74 * local_38;
        local_68 = local_68 + 1;
      }
      local_4 = 0;
    }
  }
  else if ((local_2c == 2) && (*(int *)(in_RDI + 0xb8) == 0)) {
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_84 = pvVar2->w;
    local_88 = 0;
    local_90 = 0;
    while( true ) {
      uVar5 = local_90;
      sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
      if (sVar3 <= uVar5) break;
      local_98 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,local_90);
      local_88 = local_98->h + local_88;
      local_90 = local_90 + 1;
    }
    local_a0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    Mat::create(in_stack_fffffffffffffc00,(int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
                (int)in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
                (Allocator *)in_stack_fffffffffffffbe8);
    bVar1 = Mat::empty(in_stack_fffffffffffffbe0);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      local_a8 = Mat::operator_cast_to_unsigned_char_(local_a0);
      local_b0 = 0;
      while( true ) {
        uVar5 = local_b0;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
        if (sVar3 <= uVar5) break;
        local_b8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,local_b0)
        ;
        local_bc = local_84 * local_b8->h;
        local_c8 = Mat::operator_cast_to_unsigned_char_(local_b8);
        memcpy(local_a8,local_c8,(long)local_bc * local_38);
        local_a8 = local_a8 + (long)local_bc * local_38;
        local_b0 = local_b0 + 1;
      }
      local_4 = 0;
    }
  }
  else if ((local_2c == 2) && (*(int *)(in_RDI + 0xb8) == 1)) {
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_cc = pvVar2->h;
    local_d0 = 0;
    local_d8 = 0;
    while( true ) {
      uVar5 = local_d8;
      sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
      if (sVar3 <= uVar5) break;
      local_e0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,local_d8);
      local_d0 = local_e0->w + local_d0;
      local_d8 = local_d8 + 1;
    }
    local_e8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    Mat::create(in_stack_fffffffffffffc00,(int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
                (int)in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
                (Allocator *)in_stack_fffffffffffffbe8);
    bVar1 = Mat::empty(in_stack_fffffffffffffbe0);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      for (local_ec = 0; local_ec < local_cc; local_ec = local_ec + 1) {
        local_f8 = Mat::row<unsigned_char>(local_e8,local_ec);
        local_100 = 0;
        while( true ) {
          uVar5 = local_100;
          sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
          if (sVar3 <= uVar5) break;
          local_108 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                (local_18,local_100);
          local_110 = Mat::row<unsigned_char_const>(local_108,local_ec);
          memcpy(local_f8,local_110,(long)local_108->w * local_38);
          local_f8 = local_f8 + (long)local_108->w * local_38;
          local_100 = local_100 + 1;
        }
      }
      local_4 = 0;
    }
  }
  else if ((local_2c == 3) && (*(int *)(in_RDI + 0xb8) == 0)) {
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_114 = pvVar2->w;
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_118 = pvVar2->h;
    local_11c = 0;
    local_128 = 0;
    while( true ) {
      uVar5 = local_128;
      sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
      iVar6 = (int)(in_stack_fffffffffffffbf0 >> 0x20);
      if (sVar3 <= uVar5) break;
      local_130 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,local_128)
      ;
      local_11c = local_130->c + local_11c;
      local_128 = local_128 + 1;
    }
    local_138 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    Mat::create(in_stack_fffffffffffffc00,(int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
                (int)in_stack_fffffffffffffbf8,iVar6,(size_t)in_stack_fffffffffffffbe8,
                (Allocator *)in_stack_fffffffffffffbe0);
    bVar1 = Mat::empty(in_stack_fffffffffffffbe0);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      local_13c = 0;
      local_148 = 0;
      while( true ) {
        uVar5 = local_148;
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
        if (sVar3 <= uVar5) break;
        local_150 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                              (local_18,local_148);
        local_154 = local_150->c;
        local_160 = local_150->cstep * (long)local_154;
        local_168 = Mat::operator_cast_to_unsigned_char_(local_150);
        Mat::channel(in_stack_fffffffffffffbe8,(int)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
        puVar4 = Mat::operator_cast_to_unsigned_char_(&local_1b0);
        Mat::~Mat((Mat *)0x147c78);
        local_170 = puVar4;
        memcpy(puVar4,local_168,local_160 * local_38);
        local_13c = local_154 + local_13c;
        local_148 = local_148 + 1;
      }
      local_4 = 0;
    }
  }
  else if ((local_2c == 3) && (*(int *)(in_RDI + 0xb8) == 1)) {
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_1c0 = pvVar2->w;
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_1c4 = pvVar2->c;
    local_1c8 = 0;
    local_1d0 = 0;
    while( true ) {
      uVar5 = local_1d0;
      sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
      iVar6 = (int)(in_stack_fffffffffffffbf0 >> 0x20);
      if (sVar3 <= uVar5) break;
      local_1d8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,local_1d0)
      ;
      local_1c8 = local_1d8->h + local_1c8;
      local_1d0 = local_1d0 + 1;
    }
    local_1e0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    Mat::create(in_stack_fffffffffffffc00,(int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
                (int)in_stack_fffffffffffffbf8,iVar6,(size_t)in_stack_fffffffffffffbe8,
                (Allocator *)in_stack_fffffffffffffbe0);
    bVar1 = Mat::empty(in_stack_fffffffffffffbe0);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      for (local_1e4 = 0; local_1e4 < local_1c4; local_1e4 = local_1e4 + 1) {
        Mat::channel(in_stack_fffffffffffffbe8,(int)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
        puVar4 = Mat::operator_cast_to_unsigned_char_(&local_230);
        Mat::~Mat((Mat *)0x147ec2);
        local_238 = 0;
        local_1f0 = puVar4;
        while( true ) {
          uVar5 = local_238;
          sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
          if (sVar3 <= uVar5) break;
          local_240 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                (local_18,local_238);
          local_244 = local_240->w * local_240->h;
          Mat::channel(in_stack_fffffffffffffbe8,(int)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
          puVar4 = Mat::operator_cast_to_unsigned_char_(&local_290);
          Mat::~Mat((Mat *)0x147f7a);
          local_250 = puVar4;
          memcpy(local_1f0,puVar4,(long)local_244 * local_38);
          local_1f0 = local_1f0 + (long)local_244 * local_38;
          local_238 = local_238 + 1;
        }
      }
      local_4 = 0;
    }
  }
  else if ((local_2c == 3) && (*(int *)(in_RDI + 0xb8) == 2)) {
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_294 = pvVar2->h;
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_298 = pvVar2->c;
    local_29c = 0;
    local_2a8 = 0;
    while( true ) {
      uVar5 = local_2a8;
      sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
      iVar6 = (int)(in_stack_fffffffffffffbf0 >> 0x20);
      if (sVar3 <= uVar5) break;
      local_2b0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,local_2a8)
      ;
      local_29c = local_2b0->w + local_29c;
      local_2a8 = local_2a8 + 1;
    }
    local_2b8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    Mat::create(in_stack_fffffffffffffc00,(int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
                (int)in_stack_fffffffffffffbf8,iVar6,(size_t)in_stack_fffffffffffffbe8,
                (Allocator *)in_stack_fffffffffffffbe0);
    bVar1 = Mat::empty(in_stack_fffffffffffffbe0);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      for (local_2bc = 0; local_2bc < local_298; local_2bc = local_2bc + 1) {
        this_00 = &local_308;
        Mat::channel(in_stack_fffffffffffffbe8,(int)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
        puVar4 = Mat::operator_cast_to_unsigned_char_(this_00);
        Mat::~Mat((Mat *)0x14820e);
        local_2c8 = puVar4;
        for (local_30c = 0; local_30c < local_294; local_30c = local_30c + 1) {
          local_318 = 0;
          while( true ) {
            uVar5 = local_318;
            sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
            if (sVar3 <= uVar5) break;
            local_320 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                  (local_18,local_318);
            in_stack_fffffffffffffbe0 = &local_368;
            Mat::channel(in_stack_fffffffffffffbe8,(int)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
            in_stack_fffffffffffffbe8 =
                 (Mat *)Mat::row<unsigned_char_const>(in_stack_fffffffffffffbe0,local_30c);
            Mat::~Mat((Mat *)0x1482d4);
            local_328 = in_stack_fffffffffffffbe8;
            memcpy(local_2c8,in_stack_fffffffffffffbe8,(long)local_320->w * local_38);
            local_2c8 = local_2c8 + (long)local_320->w * local_38;
            local_318 = local_318 + 1;
          }
        }
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Concat::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int dims = bottom_blobs[0].dims;
    size_t elemsize = bottom_blobs[0].elemsize;

    if (dims == 1) // axis == 0
    {
        // concat vector
        // total length
        int top_w = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        unsigned char* outptr = top_blob;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int w = bottom_blob.w;

            const unsigned char* ptr = bottom_blob;
            memcpy(outptr, ptr, w * elemsize);

            outptr += w * elemsize;
        }

        return 0;
    }

    if (dims == 2 && axis == 0)
    {
        // concat image
        int w = bottom_blobs[0].w;

        // total height
        int top_h = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        unsigned char* outptr = top_blob;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int size = w * bottom_blob.h;

            const unsigned char* ptr = bottom_blob;
            memcpy(outptr, ptr, size * elemsize);

            outptr += size * elemsize;
        }

        return 0;
    }

    if (dims == 2 && axis == 1)
    {
        // interleave image row
        int h = bottom_blobs[0].h;

        // total width
        int top_w = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=0; i<h; i++)
        {
            unsigned char* outptr = top_blob.row<unsigned char>(i);
            for (size_t b=0; b<bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                const unsigned char* ptr = bottom_blob.row<const unsigned char>(i);
                memcpy(outptr, ptr, bottom_blob.w * elemsize);

                outptr += bottom_blob.w * elemsize;
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 0)
    {
        // concat dim
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;

        // total channels
        int top_channels = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_channels += bottom_blob.c;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, top_channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int q = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int channels = bottom_blob.c;
            size_t size = bottom_blob.cstep * channels;

            const unsigned char* ptr = bottom_blob;
            unsigned char* outptr = top_blob.channel(q);
            memcpy(outptr, ptr, size * elemsize);

            q += channels;
        }

        return 0;
    }

    if (dims == 3 && axis == 1)
    {
        // interleave dim height
        int w = bottom_blobs[0].w;
        int channels = bottom_blobs[0].c;

        // total height
        int top_h = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            unsigned char* outptr = top_blob.channel(q);

            for (size_t b=0; b<bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                int size = bottom_blob.w * bottom_blob.h;

                const unsigned char* ptr = bottom_blob.channel(q);
                memcpy(outptr, ptr, size * elemsize);

                outptr += size * elemsize;
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 2)
    {
        // interleave dim width
        int h = bottom_blobs[0].h;
        int channels = bottom_blobs[0].c;

        // total height
        int top_w = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            unsigned char* outptr = top_blob.channel(q);

            for (int i=0; i<h; i++)
            {
                for (size_t b=0; b<bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob = bottom_blobs[b];

                    const unsigned char* ptr = bottom_blob.channel(q).row<const unsigned char>(i);
                    memcpy(outptr, ptr, bottom_blob.w * elemsize);

                    outptr += bottom_blob.w * elemsize;
                }
            }
        }

        return 0;
    }

    return 0;
}